

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs5SplitImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,CharCount limit,bool noResult,void *stackAllocationPointer)

{
  Type *addr;
  code *pcVar1;
  Type TVar2;
  RegexFlags RVar3;
  bool bVar4;
  uint16 uVar5;
  charcount_t inputLength;
  uint uVar6;
  JavascriptArray *arr;
  ScriptContext *scriptContext_00;
  char16 *input_00;
  GroupInfo GVar7;
  GroupInfo GVar8;
  Var newValue;
  undefined4 *puVar9;
  CharCount CVar10;
  undefined7 in_register_00000081;
  uint uVar11;
  BigIndex local_a8;
  undefined1 local_98 [8];
  RegexMatchState state;
  undefined8 local_70;
  undefined8 local_68;
  CharCount local_38;
  
  CVar10 = (CharCount)CONCAT71(in_register_00000081,noResult);
  if ((CVar10 == 0) || (((scriptContext->config).threadConfig)->m_SkipSplitOnNoResult != true)) {
    RegexHelperTrace(scriptContext,Split,regularExpression,input);
    arr = JavascriptLibrary::CreateArrayOnStack
                    ((scriptContext->super_ScriptContextBase).javascriptLibrary,
                     stackAllocationPointer);
    if (limit != 0) {
      scriptContext_00 = (ScriptContext *)(regularExpression->splitPattern).ptr;
      if (scriptContext_00 == (ScriptContext *)0x0) {
        addr = &regularExpression->splitPattern;
        scriptContext_00 = (ScriptContext *)(regularExpression->pattern).ptr;
        RVar3 = UnifiedRegex::RegexPattern::GetFlags((RegexPattern *)scriptContext_00);
        if ((RVar3 & StickyRegexFlag) != NoRegexFlags) {
          UnifiedRegex::RegexPattern::GetSource((RegexPattern *)local_98);
          RVar3 = UnifiedRegex::RegexPattern::GetFlags((RegexPattern *)scriptContext_00);
          CVar10 = (scriptContext_00->super_ScriptContextBase).isClosed & 1;
          scriptContext_00 =
               (ScriptContext *)
               CompileDynamic(scriptContext,
                              (char16 *)((ulong)((uint)local_98[4] * 2) + (long)state.input),
                              local_98._0_4_,RVar3 & ~StickyRegexFlag,SUB41(CVar10,0));
        }
        Memory::Recycler::WBSetBit((char *)addr);
        addr->ptr = (RegexPattern *)scriptContext_00;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      }
      input_00 = JavascriptString::GetString(input);
      inputLength = JavascriptString::GetLength(input);
      uVar5 = UnifiedRegex::RegexPattern::NumGroups((RegexPattern *)scriptContext_00);
      state.matcher =
           (Matcher *)
           (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
      local_38 = 0;
      PrimBeginMatch((RegexMatchState *)local_98,scriptContext,(RegexPattern *)scriptContext_00,
                     input_00,CVar10,false);
      if (inputLength == 0) {
        local_70 = (GroupInfo)0x0;
        GVar8.offset = 0;
        GVar8.length = 0;
        GVar7 = PrimMatch((RegexMatchState *)local_98,scriptContext,(RegexPattern *)scriptContext_00
                          ,0,0);
        if ((ulong)GVar7 < 0xffffffff00000000) {
          local_68 = (ulong)GVar7 >> 0x20;
          local_70 = GVar7;
        }
        else {
          JavascriptArray::BigIndex::BigIndex(&local_a8,(arr->super_ArrayObject).length);
          JavascriptArray::BigIndex::SetItem(&local_a8,arr,input);
          local_68 = (TrigramInfo *)0xffffffff;
        }
      }
      else {
        GVar8.offset = 0;
        GVar8.length = 0;
        GVar7 = PrimMatch((RegexMatchState *)local_98,scriptContext,(RegexPattern *)scriptContext_00
                          ,inputLength,0);
        local_68 = (TrigramInfo *)0xffffffff;
        local_70 = (GroupInfo)0x0;
        if ((TrigramInfo *)((ulong)GVar7 >> 0x20) != (TrigramInfo *)0xffffffff) {
          local_38 = 0;
          TVar2.ptr = (TrigramInfo *)((ulong)GVar7 >> 0x20);
          do {
            local_68 = TVar2.ptr;
            local_70 = GVar7;
            uVar6 = (uint)local_70;
            if (inputLength <= uVar6) break;
            CVar10 = (int)local_68 + uVar6;
            if (CVar10 == local_38) {
              CVar10 = local_38;
              uVar6 = uVar6 + 1;
            }
            else {
              GVar8 = (GroupInfo)local_70;
              AppendSubString(scriptContext,arr,input,local_38,uVar6);
              if (limit <= (arr->super_ArrayObject).length) break;
              uVar6 = CVar10;
              if (1 < uVar5) {
                uVar11 = 2;
                do {
                  GVar8 = UnifiedRegex::RegexPattern::GetGroup
                                    ((RegexPattern *)scriptContext_00,uVar11 - 1);
                  newValue = GetString(scriptContext,input,state.matcher,GVar8);
                  JavascriptArray::BigIndex::BigIndex(&local_a8,(arr->super_ArrayObject).length);
                  JavascriptArray::BigIndex::SetItem(&local_a8,arr,newValue);
                  if (limit <= (arr->super_ArrayObject).length) break;
                  bVar4 = uVar11 < uVar5;
                  uVar11 = uVar11 + 1;
                } while (bVar4);
              }
            }
            GVar8.length = 0;
            GVar8.offset = uVar6;
            local_38 = CVar10;
            if (inputLength <= uVar6) break;
            GVar7 = PrimMatch((RegexMatchState *)local_98,scriptContext,
                              (RegexPattern *)scriptContext_00,inputLength,uVar6);
            TVar2.ptr = (TrigramInfo *)((ulong)GVar7 >> 0x20);
          } while ((TrigramInfo *)((ulong)GVar7 >> 0x20) != (TrigramInfo *)0xffffffff);
        }
        if ((arr->super_ArrayObject).length < limit) {
          GVar8.length = 0;
          GVar8.offset = inputLength;
          AppendSubString(scriptContext,arr,input,local_38,inputLength);
        }
      }
      if (state.input != (char16 *)0x0) {
        ScriptContext::ReleaseTemporaryAllocator
                  (scriptContext,(TempArenaAllocatorObject *)state.input);
      }
      bVar4 = UnifiedRegex::RegexPattern::IsSticky((RegexPattern *)scriptContext_00);
      if (bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar9 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x719,"(!splitPattern->IsSticky())","!splitPattern->IsSticky()"
                                   );
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar9 = 0;
      }
      bVar4 = UnifiedRegex::RegexPattern::IsGlobal((RegexPattern *)scriptContext_00);
      PropagateLastMatchToRegex
                (scriptContext_00,bVar4,false,regularExpression,GVar8,(GroupInfo)0xffffffff00000000)
      ;
      PropagateLastMatchToCtor
                (scriptContext,regularExpression,input,
                 (GroupInfo)(local_70 & 0xffffffff | local_68 << 0x20),true);
    }
  }
  else {
    arr = (JavascriptArray *)
          (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
          ).nullValue.ptr;
  }
  return arr;
}

Assistant:

Var RegexHelper::RegexEs5SplitImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input, CharCount limit, bool noResult, void *const stackAllocationPointer)
    {
        if (noResult && scriptContext->GetConfig()->SkipSplitOnNoResult())
        {
            // TODO: Fix this so that the side effect for PropagateLastMatch is done
            return scriptContext->GetLibrary()->GetNull();
        }

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Split, regularExpression, input);
#endif

        JavascriptArray* ary = scriptContext->GetLibrary()->CreateArrayOnStack(stackAllocationPointer);

        if (limit == 0)
        {
            // SPECIAL CASE: Zero limit
            return ary;
        }

        UnifiedRegex::RegexPattern *splitPattern = GetSplitPattern(scriptContext, regularExpression);

        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength(); // s in spec
        const int numGroups = splitPattern->NumGroups();
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        UnifiedRegex::GroupInfo lastSuccessfulMatch; // initially undefined

        RegexMatchState state;
        PrimBeginMatch(state, scriptContext, splitPattern, inputStr, inputLength, false);

        if (inputLength == 0)
        {
            // SPECIAL CASE: Empty string
            UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, 0);
            if (match.IsUndefined())
                ary->DirectAppendItem(input);
            else
                lastSuccessfulMatch = match;
        }
        else
        {
            CharCount copyOffset = 0;  // p in spec
            CharCount startOffset = 0; // q in spec

            CharCount inputLimit = inputLength;

            while (startOffset < inputLimit)
            {
                UnifiedRegex::GroupInfo match = PrimMatch(state, scriptContext, splitPattern, inputLength, startOffset);

                if (match.IsUndefined())
                    break;

                lastSuccessfulMatch = match;

                if (match.offset >= inputLimit)
                    break;

                startOffset = match.offset;
                CharCount endOffset = match.EndOffset(); // e in spec

                if (endOffset == copyOffset)
                    startOffset++;
                else
                {
                    AppendSubString(scriptContext, ary, input, copyOffset, startOffset);
                    if (ary->GetLength() >= limit)
                        break;

                    startOffset = copyOffset = endOffset;

                    for (int groupId = 1; groupId < numGroups; groupId++)
                    {
                        ary->DirectAppendItem(GetGroup(scriptContext, splitPattern, input, nonMatchValue, groupId));
                        if (ary->GetLength() >= limit)
                            break;
                    }
                }
            }

            if (ary->GetLength() < limit)
                AppendSubString(scriptContext, ary, input, copyOffset, inputLength);
        }

        PrimEndMatch(state, scriptContext, splitPattern);
        Assert(!splitPattern->IsSticky());
        PropagateLastMatch
            ( scriptContext
            , splitPattern->IsGlobal()
            , /* isSticky */ false
            , regularExpression
            , input
            , lastSuccessfulMatch
            , UnifiedRegex::GroupInfo()
            , /* updateRegex */ true
            , /* updateCtor */ true
            , /* useSplitPattern */ true );

        return ary;
    }